

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_exch.c
# Opt level: O0

OSSL_PARAM * kdf_settable_ctx_params(void *vpkdfctx,void *provctx,char *kdfname)

{
  EVP_KDF *pEVar1;
  OSSL_LIB_CTX *in_RDX;
  PROV_CTX *in_RSI;
  OSSL_PARAM *params;
  EVP_KDF *kdf;
  EVP_KDF *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  ossl_prov_ctx_get0_libctx(in_RSI);
  pEVar1 = EVP_KDF_fetch(in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pEVar1 == (EVP_KDF *)0x0) {
    local_8 = (OSSL_PARAM *)0x0;
  }
  else {
    local_8 = EVP_KDF_settable_ctx_params(in_stack_ffffffffffffffc8);
    EVP_KDF_free((EVP_KDF *)0x324d1f);
  }
  return local_8;
}

Assistant:

static const OSSL_PARAM *kdf_settable_ctx_params(ossl_unused void *vpkdfctx,
                                                 void *provctx,
                                                 const char *kdfname)
{
    EVP_KDF *kdf = EVP_KDF_fetch(PROV_LIBCTX_OF(provctx), kdfname,
                                 NULL);
    const OSSL_PARAM *params;

    if (kdf == NULL)
        return NULL;

    params = EVP_KDF_settable_ctx_params(kdf);
    EVP_KDF_free(kdf);

    return params;
}